

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O0

void rsg::addNewUniforms(vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                         *uniforms,
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *addedUniforms,Shader *shader)

{
  bool bVar1;
  reference ppSVar2;
  Variable *pVVar3;
  char *pcVar4;
  allocator<char> local_a9;
  value_type local_a8;
  _Self local_88 [3];
  allocator<char> local_69;
  key_type local_68;
  _Self local_48;
  ShaderInput *local_40;
  ShaderInput *uniform;
  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_30;
  const_iterator i;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *shaderUniforms;
  Shader *shader_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *addedUniforms_local;
  vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *uniforms_local;
  
  i._M_current = (ShaderInput **)Shader::getUniforms(shader);
  local_30._M_current =
       (ShaderInput **)
       std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::begin
                 ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)i._M_current);
  while( true ) {
    uniform = (ShaderInput *)
              std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::end
                        ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)
                         i._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                        *)&uniform);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
              ::operator*(&local_30);
    local_40 = *ppSVar2;
    pVVar3 = ShaderInput::getVariable(local_40);
    pcVar4 = Variable::getName(pVVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar4,&local_69);
    local_48._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(addedUniforms,&local_68);
    local_88[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(addedUniforms);
    bVar1 = std::operator==(&local_48,local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    if (bVar1) {
      pVVar3 = ShaderInput::getVariable(local_40);
      pcVar4 = Variable::getName(pVVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar4,&local_a9);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(addedUniforms,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>::push_back
                (uniforms,&local_40);
    }
    __gnu_cxx::
    __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
    ::operator++(&local_30,0);
  }
  return;
}

Assistant:

void addNewUniforms (vector<const ShaderInput*>& uniforms, set<string>& addedUniforms, const Shader& shader)
{
	const vector<ShaderInput*>& shaderUniforms = shader.getUniforms();
	for (vector<ShaderInput*>::const_iterator i = shaderUniforms.begin(); i != shaderUniforms.end(); i++)
	{
		const ShaderInput* uniform = *i;
		if (addedUniforms.find(uniform->getVariable()->getName()) == addedUniforms.end())
		{
			addedUniforms.insert(uniform->getVariable()->getName());
			uniforms.push_back(uniform);
		}
	}
}